

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pedigrees.c
# Opt level: O2

void save_pedigree_leaf_from_user_worker(__cilkrts_worker *w)

{
  __cilkrts_pedigree *pedigree_leaf;
  char *pcVar1;
  undefined8 uStack_10;
  
  if (w->l->type == WORKER_USER) {
    pedigree_leaf = w->l->original_pedigree_leaf;
    if (pedigree_leaf != (__cilkrts_pedigree *)0x0) {
      pedigree_leaf->rank = (w->pedigree).rank;
      __cilkrts_set_tls_pedigree_leaf(pedigree_leaf);
      w->l->original_pedigree_leaf = (__cilkrts_pedigree *)0x0;
      return;
    }
    pcVar1 = "w->l->original_pedigree_leaf";
    uStack_10 = 0x61;
  }
  else {
    pcVar1 = "w->l->type == WORKER_USER";
    uStack_10 = 0x5c;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/pedigrees.c"
                ,uStack_10,pcVar1);
}

Assistant:

void save_pedigree_leaf_from_user_worker(__cilkrts_worker *w)
{
    CILK_ASSERT(w->l->type == WORKER_USER);

    // Existing leaf in tls should be for the current worker.
    // This assert is expensive to check though.
    // CILK_ASSERT(&w->pedigree == __cilkrts_get_tls_pedigree_leaf(0));
    CILK_ASSERT(w->l->original_pedigree_leaf);

    // w should finish with a pedigree node that points to 
    // the same root that we just looked up.

    // TODO: This assert should be valid.
    // But we are removing it now to make exceptions (without pedigrees) work.
    // Currently, reading the pedigree after an exception is caught
    // fails because the pedigree chain not restored correctly. 
    // CILK_ASSERT(w->l->original_pedigree_leaf->next == w->pedigree.parent);
    w->l->original_pedigree_leaf->rank = w->pedigree.rank;

    // Save that leaf pointer back into tls.
    __cilkrts_set_tls_pedigree_leaf(w->l->original_pedigree_leaf);
    // Null out worker's leaf for paranoia.
    w->l->original_pedigree_leaf = NULL;
}